

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O0

bool __thiscall amrex::AmrMesh::LevelDefined(AmrMesh *this,int lev)

{
  bool bVar1;
  int in_ESI;
  size_type in_RDI;
  uint3 in_stack_fffffffffffffff0;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (uint)in_stack_fffffffffffffff0;
  uVar3 = uVar2;
  if (in_ESI <= *(int *)(in_RDI + 0xc)) {
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)CONCAT44(in_ESI,uVar2),
               in_RDI);
    bVar1 = BoxArray::empty((BoxArray *)0x1373db2);
    uVar3 = 0;
    if (!bVar1) {
      Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::operator[]
                ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
                 (CONCAT44(in_ESI,uVar2) & 0xffffffff00ffffff),in_RDI);
      bVar1 = DistributionMapping::empty((DistributionMapping *)0x1373ddc);
      uVar3 = (uint)(bVar1 ^ 0xff) << 0x18;
    }
  }
  return (bool)((byte)(uVar3 >> 0x18) & 1);
}

Assistant:

bool
AmrMesh::LevelDefined (int lev) noexcept
{
    return lev <= max_level && !grids[lev].empty() && !dmap[lev].empty();
}